

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::defaultUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  bool bVar1;
  uint local_90;
  int local_8c;
  int32 n;
  int i;
  uint8 *verts [2];
  VertexElement dcl [12];
  InstanceDataHeader *header_local;
  Geometry *geo_local;
  
  _n = d3d::lockVertices(header->vertexStream[0].vertexBuffer,0,0,0);
  verts[0] = d3d::lockVertices(header->vertexStream[1].vertexBuffer,0,0,0);
  getDeclaration(header->vertexDeclaration,(VertexElement *)(verts + 1));
  local_8c = 0;
  while( true ) {
    bVar1 = true;
    if (*(char *)((long)verts + (long)local_8c * 8 + 0xe) == '\0') {
      bVar1 = *(char *)((long)verts + (long)local_8c * 8 + 0xf) != '\0';
    }
    if (!bVar1) break;
    local_8c = local_8c + 1;
  }
  uninstV3d(*(int *)(d3d::vertFormatMap +
                    (ulong)*(byte *)((long)verts + (long)local_8c * 8 + 0xc) * 4),
            geo->morphTargets->vertices,
            (uint8 *)(*(long *)(&n + (ulong)*(ushort *)(verts + (long)local_8c + 1) * 2) +
                     (long)(int)(uint)*(ushort *)((long)verts + (long)local_8c * 8 + 10)),
            header->totalNumVertex,
            header->vertexStream[*(ushort *)(verts + (long)local_8c + 1)].stride);
  if ((geo->flags & 8) != 0) {
    local_8c = 0;
    while( true ) {
      bVar1 = true;
      if (*(char *)((long)verts + (long)local_8c * 8 + 0xe) == '\n') {
        bVar1 = *(char *)((long)verts + (long)local_8c * 8 + 0xf) != '\0';
      }
      if (!bVar1) break;
      local_8c = local_8c + 1;
    }
    uninstColor(*(int *)(d3d::vertFormatMap +
                        (ulong)*(byte *)((long)verts + (long)local_8c * 8 + 0xc) * 4),geo->colors,
                (uint8 *)(*(long *)(&n + (ulong)*(ushort *)(verts + (long)local_8c + 1) * 2) +
                         (long)(int)(uint)*(ushort *)((long)verts + (long)local_8c * 8 + 10)),
                header->totalNumVertex,
                header->vertexStream[*(ushort *)(verts + (long)local_8c + 1)].stride);
  }
  for (local_90 = 0; (int)local_90 < geo->numTexCoordSets; local_90 = local_90 + 1) {
    local_8c = 0;
    while( true ) {
      bVar1 = true;
      if (*(char *)((long)verts + (long)local_8c * 8 + 0xe) == '\x05') {
        bVar1 = *(byte *)((long)verts + (long)local_8c * 8 + 0xf) != local_90;
      }
      if (!bVar1) break;
      local_8c = local_8c + 1;
    }
    uninstTexCoords(*(int *)(d3d::vertFormatMap +
                            (ulong)*(byte *)((long)verts + (long)local_8c * 8 + 0xc) * 4),
                    geo->texCoords[(int)local_90],
                    (uint8 *)(*(long *)(&n + (ulong)*(ushort *)(verts + (long)local_8c + 1) * 2) +
                             (long)(int)(uint)*(ushort *)((long)verts + (long)local_8c * 8 + 10)),
                    header->totalNumVertex,
                    header->vertexStream[*(ushort *)(verts + (long)local_8c + 1)].stride);
  }
  if ((geo->flags & 0x10) != 0) {
    local_8c = 0;
    while( true ) {
      bVar1 = true;
      if (*(char *)((long)verts + (long)local_8c * 8 + 0xe) == '\x03') {
        bVar1 = *(char *)((long)verts + (long)local_8c * 8 + 0xf) != '\0';
      }
      if (!bVar1) break;
      local_8c = local_8c + 1;
    }
    uninstV3d(*(int *)(d3d::vertFormatMap +
                      (ulong)*(byte *)((long)verts + (long)local_8c * 8 + 0xc) * 4),
              geo->morphTargets->normals,
              (uint8 *)(*(long *)(&n + (ulong)*(ushort *)(verts + (long)local_8c + 1) * 2) +
                       (long)(int)(uint)*(ushort *)((long)verts + (long)local_8c * 8 + 10)),
              header->totalNumVertex,
              header->vertexStream[*(ushort *)(verts + (long)local_8c + 1)].stride);
  }
  d3d::unlockVertices(_n);
  d3d::unlockVertices(verts[0]);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	VertexElement dcl[NUMDECLELT];

	uint8 *verts[2];
	verts[0] = lockVertices(header->vertexStream[0].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	verts[1] = lockVertices(header->vertexStream[1].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	getDeclaration(header->vertexDeclaration, dcl);

	int i;
	for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
		;
	uninstV3d(vertFormatMap[dcl[i].type],
		  geo->morphTargets[0].vertices,
	          verts[dcl[i].stream] + dcl[i].offset,
		  header->totalNumVertex,
		  header->vertexStream[dcl[i].stream].stride);

	if(geo->flags & Geometry::PRELIT){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		uninstColor(vertFormatMap[dcl[i].type],
			    geo->colors,
		            verts[dcl[i].stream] + dcl[i].offset,
			    header->totalNumVertex,
			    header->vertexStream[dcl[i].stream].stride);
	}

	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
			;
		uninstTexCoords(vertFormatMap[dcl[i].type],
			  geo->texCoords[n],
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	if(geo->flags & Geometry::NORMALS){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		uninstV3d(vertFormatMap[dcl[i].type],
			  geo->morphTargets[0].normals,
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	unlockVertices(verts[0]);
	unlockVertices(verts[1]);
}